

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

void __thiscall tiles::Wire::setDirection(Wire *this,Chunk *chunk,uint tileIndex,t direction)

{
  TileData TVar1;
  TileData *pTVar2;
  byte in_CL;
  t tempState;
  TileData *tileData;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  TileType *in_stack_ffffffffffffffe0;
  
  pTVar2 = TileType::modifyTileData
                     (in_stack_ffffffffffffffe0,
                      (Chunk *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0);
  if (((uint)*pTVar2 & 0x1f) == 1) {
    *pTVar2 = (TileData)((uint)*pTVar2 & 0xffffcfff | (uint)(in_CL % 2) << 0xc);
  }
  else if (((uint)*pTVar2 & 0x1f) != 4) {
    if (((uint)*pTVar2 & 0x1f) == 5) {
      if ((uint)in_CL % 2 == 1) {
        TVar1 = *pTVar2;
        *pTVar2 = (TileData)((uint)*pTVar2 & 0xfffffcff | ((uint)*pTVar2 >> 10 & 3) << 8);
        *pTVar2 = (TileData)((uint)*pTVar2 & 0xfffff3ff | (uint)(TVar1._1_1_ & 3) << 10);
      }
    }
    else {
      *pTVar2 = (TileData)((uint)*pTVar2 & 0xffffcfff | (in_CL & 3) << 0xc);
    }
  }
  return;
}

Assistant:

void Wire::setDirection(Chunk& chunk, unsigned int tileIndex, Direction::t direction) {
    auto& tileData = modifyTileData(chunk, tileIndex);
    if (tileData.id == TileId::wireStraight) {
        tileData.dir = static_cast<Direction::t>(direction % 2);
    } else if (tileData.id == TileId::wireJunction) {
    } else if (tileData.id != TileId::wireCrossover) {
        tileData.dir = direction;
    } else if (direction % 2 == 1) {
        // When a crossover wire rotates an odd number of times, the two states just flip.
        auto tempState = tileData.state1;
        tileData.state1 = tileData.state2;
        tileData.state2 = tempState;
    }
}